

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

bitwidth_t __thiscall slang::SVInt::countZeros(SVInt *this)

{
  bool bVar1;
  uint32_t uVar2;
  _If_is_unsigned_integer<unsigned_long,_int> _Var3;
  uint uVar4;
  SVInt *in_RDI;
  uint32_t wordBits;
  uint32_t i_1;
  uint32_t words;
  uint32_t i;
  bitwidth_t count;
  uint local_20;
  uint local_18;
  bitwidth_t local_14;
  bitwidth_t local_4;
  
  bVar1 = isSingleWord(in_RDI);
  if (bVar1) {
    local_4 = (in_RDI->super_SVIntStorage).bitWidth;
    _Var3 = std::popcount<unsigned_long>(0x211392);
    local_4 = local_4 - _Var3;
  }
  else {
    local_14 = 0;
    if (((in_RDI->super_SVIntStorage).unknownFlag & 1U) == 0) {
      for (local_18 = 0; uVar2 = getNumWords((SVInt *)0x2113cf), local_18 < uVar2;
          local_18 = local_18 + 1) {
        _Var3 = std::popcount<unsigned_long>(0x2113f1);
        local_14 = _Var3 + local_14;
      }
    }
    else {
      uVar2 = getNumWords((in_RDI->super_SVIntStorage).bitWidth,false);
      for (local_20 = 0; local_20 < uVar2; local_20 = local_20 + 1) {
        _Var3 = std::popcount<unsigned_long>(0x21145e);
        local_14 = _Var3 + local_14;
      }
    }
    uVar4 = (in_RDI->super_SVIntStorage).bitWidth & 0x3f;
    if (uVar4 != 0) {
      local_14 = local_14 - (0x40 - uVar4);
    }
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

bitwidth_t SVInt::countZeros() const {
    if (isSingleWord())
        return bitWidth - (bitwidth_t)std::popcount(val);

    bitwidth_t count = 0;
    if (!unknownFlag) {
        for (uint32_t i = 0; i < getNumWords(); i++)
            count += (bitwidth_t)std::popcount(~pVal[i]);
    }
    else {
        uint32_t words = getNumWords(bitWidth, false);
        for (uint32_t i = 0; i < words; i++)
            count += (bitwidth_t)std::popcount(~pVal[i] & ~pVal[i + words]);
    }

    uint32_t wordBits = bitWidth % BITS_PER_WORD;
    if (wordBits)
        count -= BITS_PER_WORD - wordBits;

    return count;
}